

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.c
# Opt level: O0

void mbedtls_arc4_setup(mbedtls_arc4_context *ctx,uchar *key,uint keylen)

{
  byte bVar1;
  uchar *m;
  uint k;
  int a;
  int j;
  int i;
  uint keylen_local;
  uchar *key_local;
  mbedtls_arc4_context *ctx_local;
  
  ctx->x = 0;
  ctx->y = 0;
  for (a = 0; a < 0x100; a = a + 1) {
    ctx->m[a] = (uchar)a;
  }
  m._4_4_ = 0;
  k = 0;
  for (a = 0; a < 0x100; a = a + 1) {
    if (keylen <= m._4_4_) {
      m._4_4_ = 0;
    }
    bVar1 = ctx->m[a];
    k = k + bVar1 + (uint)key[m._4_4_] & 0xff;
    ctx->m[a] = ctx->m[(int)k];
    ctx->m[(int)k] = bVar1;
    m._4_4_ = m._4_4_ + 1;
  }
  return;
}

Assistant:

void mbedtls_arc4_setup( mbedtls_arc4_context *ctx, const unsigned char *key,
                 unsigned int keylen )
{
    int i, j, a;
    unsigned int k;
    unsigned char *m;

    ctx->x = 0;
    ctx->y = 0;
    m = ctx->m;

    for( i = 0; i < 256; i++ )
        m[i] = (unsigned char) i;

    j = k = 0;

    for( i = 0; i < 256; i++, k++ )
    {
        if( k >= keylen ) k = 0;

        a = m[i];
        j = ( j + a + key[k] ) & 0xFF;
        m[i] = m[j];
        m[j] = (unsigned char) a;
    }
}